

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

size_t CMact_on_data(CMConnection conn,CMbuffer cm_buffer,char *buffer,size_t length)

{
  CManager cm;
  CMFormat format;
  CMUnregCMHandler p_Var1;
  FILE *pFVar2;
  CMHandlerFunc p_Var3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  __pid_t _Var16;
  ulong uVar17;
  uint *buffer_00;
  undefined8 uVar18;
  char *pcVar19;
  pthread_t pVar20;
  undefined8 uVar21;
  ssize_t length_00;
  CMbuffer p_Var22;
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  attr_list l2;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  size_t sVar31;
  byte *data_buffer;
  ulong uVar32;
  FILE *pFVar33;
  uint uVar34;
  uint uVar35;
  long lVar36;
  uint uVar37;
  size_t sVar38;
  CMbuffer cmb;
  CMincoming_format_list local_a0;
  attr_list local_98;
  CMbuffer local_90;
  timespec ts;
  char *decode_buffer;
  uint local_50;
  uint local_4c;
  size_t local_48;
  undefined8 local_40;
  CMbuffer local_38;
  
  decode_buffer = (char *)0x0;
  if (length < 4) {
    return 4 - length;
  }
  cm = conn->cm;
  lVar30 = 4;
  uVar37 = *(uint *)buffer;
  uVar12 = uVar37 & 0xffff00;
  uVar32 = 0x10;
  local_40 = 1;
  if (uVar12 == 0x414d00) {
    bVar10 = false;
LAB_0011c076:
    bVar7 = true;
    bVar11 = false;
    bVar8 = true;
    bVar6 = true;
    bVar5 = false;
    bVar9 = false;
  }
  else {
    if (uVar12 == 0x424d00) {
      bVar10 = false;
LAB_0011bfc6:
      bVar8 = true;
      bVar5 = true;
LAB_0011c001:
      bVar11 = false;
      bVar7 = true;
      bVar6 = true;
      bVar9 = false;
    }
    else if (uVar12 == 0x504d00) {
      bVar10 = false;
LAB_0011c0a3:
      bVar11 = true;
      bVar8 = true;
      bVar6 = true;
      bVar5 = true;
      bVar9 = false;
      bVar7 = false;
      uVar32 = 0xc;
    }
    else {
      bVar8 = true;
      if (uVar12 == 0x484d00) {
        bVar10 = false;
LAB_0011c054:
        bVar6 = false;
      }
      else {
        if (uVar12 == 0x4c4d00) {
          bVar10 = false;
LAB_0011bfea:
          bVar8 = false;
          bVar5 = false;
          goto LAB_0011c001;
        }
        if (uVar12 == 0x4d4100) {
          local_40 = 0;
          bVar10 = true;
          goto LAB_0011c076;
        }
        if (uVar12 == 0x4d4200) {
          local_40 = 0;
          bVar10 = true;
          goto LAB_0011bfc6;
        }
        if (uVar12 == 0x4d4400) {
          local_40 = 0;
          bVar10 = true;
        }
        else {
          if (uVar12 == 0x4d4800) {
            local_40 = 0;
            bVar10 = true;
            goto LAB_0011c054;
          }
          if (uVar12 == 0x4d4c00) {
            local_40 = 0;
            bVar10 = true;
            goto LAB_0011bfea;
          }
          if (uVar12 == 0x4d5000) {
            local_40 = 0;
            bVar10 = true;
            goto LAB_0011c0a3;
          }
          if (uVar12 != 0x444d00) {
            IntCManager_unlock(cm,
                               "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                               ,0x939);
            iVar15 = *(int *)buffer;
            if ((iVar15 != 0x5042494f) && (iVar15 != 0x4f494250)) {
              iVar15 = CMdo_non_CM_handler(conn,iVar15,buffer,length);
              IntCManager_lock(cm,
                               "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                               ,0x947);
              if (iVar15 != -1) {
                return 0;
              }
              printf("Unknown message on connection %p, failed %d, closed %d, %x\n",conn,
                     (ulong)(uint)conn->failed,(ulong)(uint)conn->closed,(ulong)*(uint *)buffer);
              iVar15 = CMtrace_val[7];
              if (conn->cm->CMTrace_file == (FILE *)0x0) {
                iVar15 = CMtrace_init(conn->cm,CMFreeVerbose);
              }
              if (iVar15 != 0) {
                if (CMtrace_PID != 0) {
                  pFVar33 = (FILE *)conn->cm->CMTrace_file;
                  _Var16 = getpid();
                  pVar20 = pthread_self();
                  fprintf(pFVar33,"P%lxT%lx - ",(long)_Var16,pVar20);
                }
                if (CMtrace_timing != 0) {
                  clock_gettime(1,(timespec *)&ts);
                  fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
                }
                fprintf((FILE *)conn->cm->CMTrace_file,
                        "Calling connection unknown message failed with dereference %p\n",conn);
              }
              fflush((FILE *)conn->cm->CMTrace_file);
              INT_CMConnection_failed(conn);
              return 0;
            }
            iVar15 = CM_pbio_query(conn,conn->trans,buffer,length);
            IntCManager_lock(cm,
                             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                             ,0x942);
            return (long)iVar15;
          }
          bVar10 = false;
        }
        bVar6 = true;
      }
      bVar11 = false;
      bVar7 = false;
      bVar5 = false;
      bVar9 = true;
      uVar32 = 8;
    }
    lVar30 = 0;
  }
  if (length <= uVar32 && uVar32 - length != 0) {
    return uVar32 - length;
  }
  uVar12 = uVar37 >> 0x18;
  if (bVar5) {
    if (bVar10) {
      uVar25 = *(ulong *)(buffer + lVar30 + 4);
      uVar12 = uVar37;
      if (bVar11) goto LAB_0011c177;
      uVar24 = *(uint *)(buffer + lVar30 + 0xc);
LAB_0011c1e4:
      uVar13 = uVar24 >> 8;
      bVar23 = (byte)(uVar24 >> 0x10);
      uVar14 = uVar24 >> 0x18;
      uVar12 = uVar37;
    }
    else {
      uVar37 = *(uint *)(buffer + lVar30 + 4);
      uVar24 = *(uint *)(buffer + lVar30 + 8);
      uVar25 = (long)(int)(uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 |
                          uVar24 << 0x18) +
               ((ulong)(uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8 |
                       uVar37 << 0x18) << 0x20);
      if (bVar11) goto LAB_0011c177;
      uVar24 = (uint)(byte)buffer[lVar30 + 0xf];
      uVar13 = (uint)(byte)buffer[lVar30 + 0xe];
      uVar14 = (uint)(byte)buffer[lVar30 + 0xc];
      bVar23 = buffer[lVar30 + 0xd];
    }
  }
  else {
    if (bVar10) {
      uVar25 = (ulong)*(int *)(buffer + lVar30 + 4);
      uVar12 = uVar37;
      if (!bVar9) {
        uVar24 = *(uint *)(buffer + lVar30 + 8);
        goto LAB_0011c1e4;
      }
    }
    else {
      uVar37 = *(uint *)(buffer + lVar30 + 4);
      uVar25 = (ulong)(int)(uVar37 >> 0x18 | (uVar37 & 0xff0000) >> 8 | (uVar37 & 0xff00) << 8 |
                           uVar37 << 0x18);
      if (!bVar9) {
        uVar24 = (uint)(byte)buffer[lVar30 + 0xb];
        uVar13 = (uint)(byte)buffer[lVar30 + 10];
        uVar14 = (uint)(byte)buffer[lVar30 + 8];
        bVar23 = buffer[lVar30 + 9];
        goto LAB_0011c210;
      }
    }
LAB_0011c177:
    uVar24 = 0;
    uVar13 = 0;
    bVar23 = 0;
    uVar14 = 0;
  }
LAB_0011c210:
  uVar17 = (uVar25 & 0xffffffffffffff) - 0xc;
  if (!bVar11) {
    uVar17 = uVar25;
  }
  sVar38 = (ulong)((uint)uVar17 & 0xffffff) - 8;
  if (bVar6) {
    sVar38 = uVar17;
  }
  uVar34 = 0;
  uVar27 = 0;
  uVar26 = 0;
  uVar28 = 0;
  local_4c = 0;
  uVar37 = 0;
  uVar35 = 0;
  if (!bVar8) {
    if (bVar7) {
      if (bVar10) {
        uVar37 = *(uint *)(buffer + lVar30 + 0xc);
        uVar28 = uVar37 >> 8;
        uVar26 = uVar37 >> 0x10;
        uVar34 = uVar37 >> 0x18;
      }
      else {
        uVar37 = (uint)(byte)buffer[lVar30 + 0xf];
        uVar28 = (uint)(byte)buffer[lVar30 + 0xe];
        uVar34 = (uint)(byte)buffer[lVar30 + 0xc];
        uVar26 = (uint)(byte)buffer[lVar30 + 0xd];
      }
    }
    uVar34 = uVar34 << 0x18;
    uVar27 = (uVar26 & 0xff) << 0x10;
    local_4c = (uVar28 & 0xff) << 8;
    uVar35 = uVar37 & 0xff;
  }
  uVar37 = uVar24 & 0xff | (uVar13 & 0xff) << 8 | (uint)bVar23 << 0x10 | uVar14 << 0x18;
  lVar30 = uVar32 + (long)(int)uVar37 + sVar38;
  sVar31 = lVar30 - length;
  if (sVar31 != 0 && (long)length <= lVar30) {
    return sVar31;
  }
  buffer_00 = (uint *)(buffer + uVar32);
  local_38 = cm_buffer;
  if (bVar6) {
    if ((byte)uVar12 != 0) {
      bVar23 = 0;
      for (uVar32 = 4; uVar32 < length; uVar32 = uVar32 + 1) {
        bVar23 = bVar23 + buffer[uVar32];
      }
      if (bVar23 != (byte)uVar12) {
        printf("Discarding incoming message because of corruption.  Checksum mismatch got %x, expected %x\n"
               ,(ulong)bVar23,(ulong)(uVar12 & 0xff));
        printf("Message was : ");
        for (sVar38 = 0; length != sVar38; sVar38 = sVar38 + 1) {
          printf(" %02x",(ulong)(byte)buffer[sVar38]);
        }
        putchar(10);
        return 0;
      }
    }
    if (bVar11) {
      CMdo_performance_response
                (conn,sVar38,(uint)(byte)(uVar25 >> 0x38),(int)local_40,(char *)buffer_00);
      return 0;
    }
    local_50 = uVar34;
    local_48 = sVar38;
    if (uVar37 == 0) {
      local_98 = (attr_list)0x0;
    }
    else {
      local_98 = CMint_decode_attr_from_xmit
                           (cm,buffer_00,
                            "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                            ,0x9fc);
      iVar15 = CMtrace_val[4];
      if (conn->cm->CMTrace_file == (FILE *)0x0) {
        iVar15 = CMtrace_init(conn->cm,CMDataVerbose);
      }
      if (iVar15 != 0) {
        fwrite("CM - Incoming read attributes -> ",0x21,1,(FILE *)cm->CMTrace_file);
        fdump_attr_list(cm->CMTrace_file,local_98);
      }
    }
    data_buffer = (byte *)((long)buffer_00 + (long)(int)uVar37);
    if (!bVar8) {
      iVar15 = CMtrace_val[4];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar15 = CMtrace_init(cm,CMDataVerbose);
      }
      if (iVar15 != 0) {
        if (CMtrace_PID != 0) {
          pFVar33 = (FILE *)cm->CMTrace_file;
          _Var16 = getpid();
          pVar20 = pthread_self();
          fprintf(pFVar33,"P%lxT%lx - ",(long)_Var16,pVar20);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,
                "CM - Receiving event message data len %ld, attr len %d, stone_id %x\n",local_48,
                (ulong)uVar37,(ulong)(uVar27 | local_50 | local_4c | uVar35));
      }
      fflush((FILE *)cm->CMTrace_file);
      if (local_98 == (attr_list)0x0) {
        local_98 = CMint_create_attr_list
                             (cm,
                              "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                              ,0xa07);
      }
      set_int_attr(local_98,CM_EVENT_SIZE,local_48);
      set_long_attr(local_98,CM_INCOMING_CONNECTION,conn);
      if (local_38 == (CMbuffer)0x0) {
        p_Var22 = fill_cmbuffer(cm,buffer,length);
        data_buffer = data_buffer + ((long)p_Var22->buffer - (long)buffer);
        cmb = p_Var22;
      }
      else {
        p_Var22 = local_38;
        cmb = (CMbuffer)0x0;
      }
      internal_cm_network_submit
                (cm,p_Var22,local_98,conn,data_buffer,local_48,uVar27 | local_50 | local_4c | uVar35
                );
      if (cmb != (CMbuffer)0x0) {
        cm_return_data_buf(cm,cmb);
      }
      free_attr_list(local_98);
      return 0;
    }
    uVar18 = FMContext_from_FFS(cm->FFScontext);
    lVar30 = FMformat_from_ID(uVar18,data_buffer);
    if (lVar30 == 0) {
      pcVar19 = "BAD INCOMING DATA";
LAB_0011ca81:
      puts(pcVar19);
      return 0;
    }
    pcVar19 = (char *)name_of_FMformat(lVar30);
    for (lVar30 = 0; lVar30 < cm->reg_format_count; lVar30 = lVar30 + 1) {
      format = cm->reg_formats[lVar30];
      if ((format->registration_pending != 0) &&
         (iVar15 = strcmp(pcVar19,format->format_name), iVar15 == 0)) {
        CMcomplete_format_registration(format,0);
      }
    }
    lVar30 = FFS_target_from_encode(conn->cm->FFScontext,data_buffer);
    uVar18 = FFSTypeHandle_from_encode(conn->cm->FFScontext,data_buffer);
    if (lVar30 == 0) {
      p_Var1 = conn->cm->unregistered_format_handler;
      if (p_Var1 != (CMUnregCMHandler)0x0) {
        uVar18 = FMFormat_of_original(uVar18);
        pcVar19 = (char *)name_of_FMformat(uVar18);
        (*p_Var1)(conn,pcVar19);
        return 0;
      }
      fwrite("No conversion found for incoming CM message\n",0x2c,1,_stderr);
      return 0;
    }
    iVar15 = CMtrace_val[4];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar15 = CMtrace_init(cm,CMDataVerbose);
    }
    if (iVar15 != 0) {
      if (CMtrace_PID != 0) {
        pFVar33 = (FILE *)cm->CMTrace_file;
        _Var16 = getpid();
        pVar20 = pthread_self();
        fprintf(pFVar33,"P%lxT%lx - ",(long)_Var16,pVar20);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      pFVar33 = (FILE *)cm->CMTrace_file;
      uVar21 = FMFormat_of_original(uVar18);
      uVar21 = name_of_FMformat(uVar21);
      fprintf(pFVar33,"CM - Receiving record of type %s, FFSformat %p\n",uVar21,uVar18);
    }
    local_40 = uVar18;
    fflush((FILE *)cm->CMTrace_file);
    lVar29 = 0;
    local_a0 = (CMincoming_format_list)0x0;
    for (lVar36 = 0; uVar18 = local_40, lVar36 < cm->in_format_count; lVar36 = lVar36 + 1) {
      if (*(long *)((long)&cm->in_formats->format + lVar29) == lVar30) {
        local_a0 = (CMincoming_format_list)((long)&cm->in_formats->format + lVar29);
        iVar15 = CMtrace_val[4];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar15 = CMtrace_init(cm,CMDataVerbose);
        }
        if (iVar15 != 0) {
          if (CMtrace_PID != 0) {
            pFVar33 = (FILE *)cm->CMTrace_file;
            _Var16 = getpid();
            pVar20 = pthread_self();
            fprintf(pFVar33,"P%lxT%lx - ",(long)_Var16,pVar20);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fprintf((FILE *)cm->CMTrace_file,
                  "CM - Found incoming cm_format %p, matching FFSformat %p\n",local_a0,lVar30);
        }
        fflush((FILE *)cm->CMTrace_file);
      }
      lVar29 = lVar29 + 0x48;
    }
    if (local_a0 == (CMincoming_format_list)0x0) {
      local_a0 = CMidentify_rollbackCMformat(cm,(char *)data_buffer);
      iVar15 = CMtrace_val[4];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar15 = CMtrace_init(cm,CMDataVerbose);
      }
      if (iVar15 != 0) {
        if (CMtrace_PID != 0) {
          pFVar33 = (FILE *)cm->CMTrace_file;
          _Var16 = getpid();
          pVar20 = pthread_self();
          fprintf(pFVar33,"P%lxT%lx - ",(long)_Var16,pVar20);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"CM - Created cm_format %p, matching FFSformat %p\n",
                local_a0,uVar18);
      }
      fflush((FILE *)cm->CMTrace_file);
      if (local_a0 == (CMincoming_format_list)0x0) goto LAB_0011d712;
      iVar15 = CMtrace_val[4];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar15 = CMtrace_init(cm,CMDataVerbose);
      }
      if (iVar15 != 0) {
        if (CMtrace_PID != 0) {
          pFVar33 = (FILE *)cm->CMTrace_file;
          _Var16 = getpid();
          pVar20 = pthread_self();
          fprintf(pFVar33,"P%lxT%lx - ",(long)_Var16,pVar20);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        pFVar33 = (FILE *)cm->CMTrace_file;
        uVar21 = FMFormat_of_original(uVar18);
        uVar21 = name_of_FMformat(uVar21);
        fprintf(pFVar33,"CM - Calling CMcreate_conversion type %s, format %p\n",uVar21,uVar18);
      }
      fflush((FILE *)cm->CMTrace_file);
      CMcreate_conversion(cm,local_a0);
      iVar15 = CMtrace_val[4];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar15 = CMtrace_init(cm,CMDataVerbose);
      }
      if (iVar15 != 0) {
        if (CMtrace_PID != 0) {
          pFVar33 = (FILE *)cm->CMTrace_file;
          _Var16 = getpid();
          pVar20 = pthread_self();
          fprintf(pFVar33,"P%lxT%lx - ",(long)_Var16,pVar20);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        pFVar33 = (FILE *)cm->CMTrace_file;
        uVar37 = FFShas_conversion(uVar18);
        fprintf(pFVar33,"CM - after CMcreate_conversion format %p, has_conversion is %d\n",uVar18,
                (ulong)uVar37);
      }
      fflush((FILE *)cm->CMTrace_file);
    }
    if (local_a0->handler == (CMHandlerFunc)0x0) {
LAB_0011d712:
      pFVar33 = _stderr;
      uVar18 = FMFormat_of_original(uVar18);
      uVar18 = name_of_FMformat(uVar18);
      fprintf(pFVar33,"CM - No handler for incoming data of this version of format \"%s\"\n",uVar18)
      ;
      return 0;
    }
    iVar15 = FFShas_conversion(uVar18);
    if (iVar15 == 0) {
      CMcreate_conversion(cm,local_a0);
    }
    iVar15 = FFShas_conversion(uVar18);
    if (iVar15 == 0) {
      __assert_fail("FFShas_conversion(original_format)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                    ,0xa51,"size_t CMact_on_data(CMConnection, CMbuffer, char *, size_t)");
    }
    iVar15 = FFSdecode_in_place_possible(uVar18);
    if (iVar15 == 0) {
      length_00 = FFS_est_decode_length(cm->FFScontext,data_buffer,local_48);
      local_90 = cm_get_data_buf(cm,length_00);
      decode_buffer = (char *)local_90->buffer;
      FFSdecode_to_buffer(cm->FFScontext,data_buffer);
    }
    else {
      iVar15 = FFSdecode_in_place(cm->FFScontext,data_buffer,&decode_buffer);
      if (iVar15 == 0) {
        pcVar19 = "Decode failed";
        goto LAB_0011ca81;
      }
      local_90 = (CMbuffer)0x0;
    }
    iVar15 = CMtrace_val[4];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar15 = CMtrace_init(conn->cm,CMDataVerbose);
    }
    if (iVar15 != 0) {
      if (CMact_on_data_size_set == '\0') {
        pcVar19 = getenv("CMDumpSize");
        CMact_on_data_size_set = '\x01';
        if (pcVar19 != (char *)0x0) {
          CMact_on_data::dump_char_limit = atoi(pcVar19);
        }
      }
      pFVar33 = (FILE *)cm->CMTrace_file;
      uVar18 = FMFormat_of_original(local_a0->format);
      uVar18 = name_of_FMformat(uVar18);
      fprintf(pFVar33,"CM - record type %s, contents are:\n  ",uVar18);
      pFVar2 = cm->CMTrace_file;
      uVar18 = FMFormat_of_original(local_a0->format);
      iVar15 = FMfdump_data(pFVar2,uVar18,decode_buffer,CMact_on_data::dump_char_limit);
      if (iVar15 == 0 && CMact_on_data::warned == 0) {
        puts("\n\n  ****  Warning **** CM record dump truncated");
        puts("  To change size limits, set CMDumpSize environment variable.");
        CMact_on_data::warned = CMact_on_data::warned + 1;
      }
      fwrite("\n=======\n",9,1,(FILE *)cm->CMTrace_file);
    }
    if (local_98 == (attr_list)0x0) {
      local_98 = CMint_create_attr_list
                           (cm,
                            "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                            ,0xa7c);
      l2 = conn->attrs;
      iVar15 = 0xa7d;
    }
    else {
      l2 = conn->attrs;
      iVar15 = 0xa7f;
    }
    CMint_attr_merge_lists
              (cm,local_98,l2,
               "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
               ,iVar15);
    iVar15 = CMtrace_val[7];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar15 = CMtrace_init(cm,CMFreeVerbose);
    }
    if (iVar15 != 0) {
      if (CMtrace_PID != 0) {
        pFVar33 = (FILE *)cm->CMTrace_file;
        _Var16 = getpid();
        pVar20 = pthread_self();
        fprintf(pFVar33,"P%lxT%lx - ",(long)_Var16,pVar20);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"CM - add reference connection %p - handler\n",conn);
    }
    fflush((FILE *)cm->CMTrace_file);
    INT_CMConnection_add_reference(conn);
    p_Var3 = local_a0->handler;
    pvVar4 = local_a0->client_data;
    if (local_38 == (CMbuffer)0x0 && decode_buffer == (char *)0x0) {
      p_Var22 = fill_cmbuffer(cm,buffer,length);
    }
    else {
      p_Var22 = (CMbuffer)0x0;
    }
    IntCManager_unlock(cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                       ,0xa8f);
    (*p_Var3)(cm,conn,decode_buffer,pvVar4,local_98);
    IntCManager_lock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                     ,0xa91);
    if (p_Var22 != (CMbuffer)0x0) {
      cm_return_data_buf(cm,p_Var22);
    }
    uVar18 = local_40;
    iVar15 = CMtrace_val[7];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar15 = CMtrace_init(cm,CMFreeVerbose);
    }
    if (iVar15 != 0) {
      if (CMtrace_PID != 0) {
        pFVar33 = (FILE *)cm->CMTrace_file;
        _Var16 = getpid();
        pVar20 = pthread_self();
        fprintf(pFVar33,"P%lxT%lx - ",(long)_Var16,pVar20);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"CM - delete reference connection %p - handler\n",conn);
    }
    fflush((FILE *)cm->CMTrace_file);
    INT_CMConnection_dereference(conn);
    if (local_90 != (CMbuffer)0x0) {
      cm_return_data_buf(cm,local_90);
    }
    if (local_98 != (attr_list)0x0) {
      CMint_free_attr_list
                (cm,local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                 ,0xa9b);
    }
    iVar15 = CMtrace_val[4];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar15 = CMtrace_init(cm,CMDataVerbose);
    }
    if (iVar15 != 0) {
      if (CMtrace_PID != 0) {
        pFVar33 = (FILE *)cm->CMTrace_file;
        _Var16 = getpid();
        pVar20 = pthread_self();
        fprintf(pFVar33,"P%lxT%lx - ",(long)_Var16,pVar20);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      pFVar33 = (FILE *)cm->CMTrace_file;
      uVar18 = FMFormat_of_original(uVar18);
      uVar18 = name_of_FMformat(uVar18);
      fprintf(pFVar33,"CM - Finish processing - record of type %s\n",uVar18);
    }
    pFVar33 = (FILE *)cm->CMTrace_file;
    goto LAB_0011c928;
  }
  if (bVar10) {
    uVar37 = *buffer_00;
    uVar12 = buffer_00[1];
    uVar34 = uVar37 >> 8;
    uVar28 = uVar37 >> 0x10;
    uVar24 = uVar37 >> 0x18;
    uVar13 = uVar12 >> 8;
    uVar14 = uVar12 >> 0x10;
    bVar23 = (byte)(uVar12 >> 0x18);
  }
  else {
    uVar37 = (uint)*(byte *)((long)buffer_00 + 3);
    uVar34 = (uint)*(byte *)((long)buffer_00 + 2);
    uVar24 = (uint)(byte)*buffer_00;
    uVar28 = (uint)*(byte *)((long)buffer_00 + 1);
    uVar12 = (uint)*(byte *)((long)buffer_00 + 7);
    uVar13 = (uint)*(byte *)((long)buffer_00 + 6);
    uVar14 = (uint)*(byte *)((long)buffer_00 + 5);
    bVar23 = (byte)buffer_00[1];
  }
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar15 = CMtrace_init(cm,CMLowLevelVerbose);
    if (iVar15 != 0) goto LAB_0011c3e5;
  }
  else if (CMtrace_val[3] != 0) {
LAB_0011c3e5:
    if (CMtrace_PID != 0) {
      pFVar33 = (FILE *)conn->cm->CMTrace_file;
      _Var16 = getpid();
      pVar20 = pthread_self();
      fprintf(pFVar33,"P%lxT%lx - ",(long)_Var16,pVar20);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fwrite("CM - Received CONN handshake message\n",0x25,1,(FILE *)conn->cm->CMTrace_file);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  if (conn->remote_format_server_ID == 0) {
    conn->remote_format_server_ID =
         uVar37 & 0xff | (uVar34 & 0xff) << 8 | (uVar28 & 0xff) << 0x10 | uVar24 << 0x18;
    conn->remote_CManager_ID =
         uVar12 & 0xff |
         (uVar13 & 0xff) << 8 | (uVar14 & 0xff) << 0x10 | (uint)(bVar23 & 0x7f) << 0x18;
    iVar15 = CMtrace_val[3];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar15 = CMtrace_init(conn->cm,CMLowLevelVerbose);
    }
    if (iVar15 != 0) {
      if (CMtrace_PID != 0) {
        pFVar33 = (FILE *)conn->cm->CMTrace_file;
        _Var16 = getpid();
        pVar20 = pthread_self();
        fprintf(pFVar33,"P%lxT%lx - ",(long)_Var16,pVar20);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,"CM - CONN handshake condition %d\n",
              (ulong)(uint)conn->handshake_condition);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    if (conn->handshake_condition != -1) {
      INT_CMCondition_signal(conn->cm,conn->handshake_condition);
      conn->handshake_condition = -1;
    }
  }
  else if (conn->remote_format_server_ID ==
           (uVar37 & 0xff | (uVar34 & 0xff) << 8 | (uVar28 & 0xff) << 0x10 | uVar24 << 0x18)) {
    printf("Less Gaak.  Got a second handshake on connection 0x%p, remote id %x\n",conn);
  }
  else {
    printf("Gaak.  Got a second handshake on connection 0x%p, with a different format server ID %x vs. %x\n"
           ,conn);
  }
  if (-1 < (char)bVar23) {
    iVar15 = CMtrace_val[3];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar15 = CMtrace_init(conn->cm,CMLowLevelVerbose);
    }
    if (iVar15 != 0) {
      if (CMtrace_PID != 0) {
        pFVar33 = (FILE *)conn->cm->CMTrace_file;
        _Var16 = getpid();
        pVar20 = pthread_self();
        fprintf(pFVar33,"P%lxT%lx - ",(long)_Var16,pVar20);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fwrite("CM - Sending CONN handshake message\n",0x24,1,(FILE *)conn->cm->CMTrace_file);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    send_and_maybe_wait_for_handshake(conn->cm,conn);
    return 0;
  }
  iVar15 = CMtrace_val[3];
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar15 = CMtrace_init(conn->cm,CMLowLevelVerbose);
  }
  if (iVar15 != 0) {
    if (CMtrace_PID != 0) {
      pFVar33 = (FILE *)conn->cm->CMTrace_file;
      _Var16 = getpid();
      pVar20 = pthread_self();
      fprintf(pFVar33,"P%lxT%lx - ",(long)_Var16,pVar20);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fwrite("CM - *NOT* Sending CONN handshake message\n",0x2a,1,(FILE *)conn->cm->CMTrace_file);
  }
  pFVar33 = (FILE *)conn->cm->CMTrace_file;
LAB_0011c928:
  fflush(pFVar33);
  return 0;
}

Assistant:

static size_t
 CMact_on_data(CMConnection conn, CMbuffer cm_buffer, char *buffer, size_t length)
 {
     char *base = buffer;
     char *check_sum_base = buffer;
     int byte_swap = 0;
     int get_attrs = 0;
     int skip = 0;
     int performance_msg = 0, event_msg = 0, evcontrol_msg = 0, handshake = 0;
     int performance_func = 0, handshake_version = 0;
     CMbuffer cm_decode_buf = NULL;
     attr_list attrs = NULL;
     int64_t data_length, decoded_length;
     int attr_length = 0, i;
     int header_len;
     int stone_id;
     char *decode_buffer = NULL, *data_buffer;
     FFSTypeHandle local_format, original_format;
     CManager cm = conn->cm;
     CMincoming_format_list cm_format = NULL;
     int message_key;
     unsigned char checksum;
     int short_length = 1;

     if (length < 4) {
	 return 4 - length;
     }
     message_key = 0x00ffff00 & *((int*)buffer);
     switch (message_key) {  /* assume 4-byte int */
     case 0x00444d00: /* \0DMC reversed byte order */
	 byte_swap = 1;
     case 0x004d4400:  /* CMD\0 */
	 break;
     case 0x00424d00: /* \0BMC reversed byte order long msg*/
	 byte_swap = 1;
     case 0x004d4200:  /* CMB\0 long msg*/
	 short_length = 0;
	 get_attrs = 1;
	 break;
     case 0x00414d00: /* \0AMC reversed byte order */
	 byte_swap = 1;
     case 0x004d4100:  /* CMA\0 */
	 get_attrs = 1;
	 break;
     case 0x00005645: /* \0CVE reversed byte order */
	 byte_swap = 1;
     case 0x45560000: /* EVC\0 */
	 evcontrol_msg = 1;
	 break;
     case 0x00504d00: /* \0PMC reversed byte order */
	 byte_swap = 1;
     case 0x004d5000:  /* CMP\0 */
	 performance_msg = 1;
	 short_length = 0;
	 break;
     case 0x004c4d00: /* \0LMC reversed byte order */
	 byte_swap = 1;
     case 0x004d4c00:  /* CML\0 */
	 event_msg = 1;
	 get_attrs = 1;
	 break;
     case 0x00484d00: /* \0HMC reversed byte order - handshake */
	 byte_swap = 1;
     case 0x004d4800:  /* CMH\0 - handshake */
	 handshake = 1;
	 get_attrs = 0;
	 break;
     default:
	 /*  non CM message */
	 /*  lookup registered message prefixes and try to find handler */
	 /*  otherwise give up */
       {
	   int ret;
	   CMbuffer local = NULL;
 #ifdef EVER_HAVE_HANDLERS_OTHER_THAN_PBIO
	   if (cm_buffer == NULL) {
	       local = fill_cmbuffer(cm, buffer, length);
	       buffer = local->buffer;
	   }
 #endif
	   CManager_unlock(cm);
	   switch (*(int*)buffer) {
	   case 0x5042494f:
	   case 0x4f494250:  /* incoming FFS format protocol message */
	     {
	       extern int CM_pbio_query(CMConnection conn, CMTransport trans,
					char *buffer, size_t length);
	       
	       size_t ret = CM_pbio_query(conn, conn->trans, buffer, length);
	       CManager_lock(cm);
	       return ret;
	     }
	   }
	   ret = CMdo_non_CM_handler(conn, *(int*)buffer, buffer, length);
	   CManager_lock(cm);
	   if (local) cm_return_data_buf(cm, local);
	   if (ret == -1) {
	       printf("Unknown message on connection %p, failed %d, closed %d, %x\n", conn, conn->failed, conn->closed, *(int*)buffer);
	       CMtrace_out(conn->cm, CMFreeVerbose, "Calling connection unknown message failed with dereference %p\n", conn);
	       INT_CMConnection_failed(conn);
	   }
	   return 0;
       }
     }

     if (get_attrs == 1) {
	 if (!event_msg) {
	     header_len = 16;/* magic plus two 4-byte sizes (attrs + data) */
	     skip = 4;
	 } else {
	     header_len = 16;
	 }
	 if (!short_length) {
	     header_len = 16; /* extra data length bytes */
	     skip = 0;
	 }
     } else {
	 if (short_length) {
	     header_len = 8; /* magic plus 4-byte size */
	 } else {
	     header_len = 12; /* magic plus 8-byte size */
	 }
     }

     if (length < header_len) {
	 return header_len - length;
     }
     base = buffer + 4 + skip; /* skip used data */
     if (short_length) {
	 if (byte_swap) {
	     int tmp;
 #ifdef WORDS_BIGENDIAN	    
	     checksum = (unsigned char) check_sum_base[0];
 #else
	     checksum = (unsigned char) check_sum_base[3];
 #endif
	     ((char*)&tmp)[0] = base[3];
	     ((char*)&tmp)[1] = base[2];
	     ((char*)&tmp)[2] = base[1];
	     ((char*)&tmp)[3] = base[0];
	     data_length = tmp;
	     if (header_len != 8) {
		 ((char*)&attr_length)[0] = base[7];
		 ((char*)&attr_length)[1] = base[6];
		 ((char*)&attr_length)[2] = base[5];
		 ((char*)&attr_length)[3] = base[4];
	     }
	 } else {
 #ifdef WORDS_BIGENDIAN	    
	     checksum = (unsigned char) check_sum_base[3];
 #else
	     checksum = (unsigned char) check_sum_base[0];
 #endif
	     data_length = ((int *) base)[0];
	     if (header_len != 8) {
		 attr_length = ((int *) base)[1];
	     }
	 }
     } else {
	 if (byte_swap) {
 #ifdef WORDS_BIGENDIAN	    
	     checksum = (unsigned char) check_sum_base[0];
 #else
	     checksum = (unsigned char) check_sum_base[3];
 #endif
	     int tmp;
	     ((char*)&tmp)[0] = base[3];
	     ((char*)&tmp)[1] = base[2];
	     ((char*)&tmp)[2] = base[1];
	     ((char*)&tmp)[3] = base[0];
	     data_length = ((int64_t)tmp) << 32;
	     ((char*)&tmp)[0] = base[7];
	     ((char*)&tmp)[1] = base[6];
	     ((char*)&tmp)[2] = base[5];
	     ((char*)&tmp)[3] = base[4];
	     data_length += tmp;
	     if (header_len != 12) {
		 ((char*)&attr_length)[0] = base[11];
		 ((char*)&attr_length)[1] = base[10];
		 ((char*)&attr_length)[2] = base[9];
		 ((char*)&attr_length)[3] = base[8];
	     }
	 } else {
 #ifdef WORDS_BIGENDIAN	    
	     checksum = (unsigned char) check_sum_base[3];
 #else
	     checksum = (unsigned char) check_sum_base[0];
 #endif
	     data_length = ((int64_t)(((unsigned int *) base)[1])) << 32;
	     data_length += ((unsigned int *) base)[0];
	     if (header_len != 12) {
		 attr_length = ((int *) base)[2];
	     }
	 }
     }
     if (performance_msg || evcontrol_msg) {
	 performance_func = 0xff & (data_length >> 56);
	 data_length &= 0xffffffffffffff;
	 data_length -= 12;  /* subtract off header size */
     }
     if (handshake) {
	 handshake_version = 0xff & (data_length >> 24);
	 data_length &= 0xffffff;
	 data_length -= 8;  /* subtract off header size */
     }
     if (event_msg) {
	 char *stone_base = base;
	 if (header_len == 16) {
	     if (byte_swap) {
		 ((char*)&stone_id)[0] = stone_base[11];
		 ((char*)&stone_id)[1] = stone_base[10];
		 ((char*)&stone_id)[2] = stone_base[9];
		 ((char*)&stone_id)[3] = stone_base[8];
	     } else {
		 stone_id = ((int *) stone_base)[2];
	     }
	 } else if (header_len == 20) {
	     if (byte_swap) {
		 ((char*)&stone_id)[0] = stone_base[15];
		 ((char*)&stone_id)[1] = stone_base[14];
		 ((char*)&stone_id)[2] = stone_base[13];
		 ((char*)&stone_id)[3] = stone_base[12];
	     } else {
		 stone_id = ((int *) stone_base)[3];
	     }
	 }
     }

     if ((ssize_t)length < header_len + data_length + attr_length) {
	 return header_len + data_length + attr_length - 
	     length;
     }
     /* At this point, the message is accepted.  Determine processing */
     base = buffer + header_len;
     if (handshake) {
	 CMdo_handshake(conn, handshake_version, byte_swap, base);
	 return 0;
     }
     if (checksum != 0) {
	 unsigned char calculated_checksum = 0;
	 for (i=4; i < length; i++) {
	     calculated_checksum += ((unsigned char *)buffer)[i];
	 }
	 if (calculated_checksum != checksum) {
	     printf("Discarding incoming message because of corruption.  Checksum mismatch got %x, expected %x\n",
		    calculated_checksum, checksum);
	     printf("Message was : ");
	     for (i=0 ; i < length; i++) {
		 printf(" %02x",  ((unsigned char *)buffer)[i]);
	     }
	     printf("\n");
	     return 0;
	 }
     }
     if (performance_msg) {
	 CMdo_performance_response(conn, data_length, performance_func, byte_swap,
				   base);
	 return 0;
     } else if (evcontrol_msg) {
	 int arg;
	 if (byte_swap) {
	     ((char*)&arg)[0] = base[3];
	     ((char*)&arg)[1] = base[2];
	     ((char*)&arg)[2] = base[1];
	     ((char*)&arg)[3] = base[0];
	 } else {
	     arg = ((int *) base)[0];
	 }
 #ifdef EV_INTERNAL_H
	 INT_EVhandle_control_message(conn->cm, conn, (unsigned char) performance_func, arg);
 #endif
	 return 0;
     }
     data_buffer = base + attr_length;
     if (attr_length != 0) {
	 attrs = CMdecode_attr_from_xmit(conn->cm, base);
	 if (CMtrace_on(conn->cm, CMDataVerbose)) {
	     fprintf(cm->CMTrace_file, "CM - Incoming read attributes -> ");
	     fdump_attr_list(cm->CMTrace_file, attrs);
	 }
     }
     if (event_msg) {
	 CMbuffer local = NULL;
	 CMtrace_out(cm, CMDataVerbose, "CM - Receiving event message data len %"  PRId64 ", attr len %d, stone_id %x\n",
		     data_length, attr_length, stone_id);
	 if (attrs == NULL){
	     attrs = CMcreate_attr_list(cm);
	 }
	 set_int_attr(attrs, CM_EVENT_SIZE, (int)data_length);
	 set_long_attr(attrs, CM_INCOMING_CONNECTION, (intptr_t)conn);

	 if (cm_buffer == NULL) {
	     local = fill_cmbuffer(cm, buffer, length);
	     data_buffer = (data_buffer - buffer) + (char*)local->buffer;
	     buffer = local->buffer;
	     cm_buffer = local;
	 }
 #ifdef EV_INTERNAL_H	
	 internal_cm_network_submit(cm, cm_buffer, attrs, conn, data_buffer,
				    data_length, stone_id);
 #endif
	 if (local) cm_return_data_buf(cm, local);
	 free_attr_list(attrs);
	 return 0;
     }
     {
	 FMFormat format = FMformat_from_ID(FMContext_from_FFS(cm->FFScontext), data_buffer);
	 char *incoming_name;
	 if (format == NULL) {
	     printf("BAD INCOMING DATA\n");
	     return 0;
	 }
	 incoming_name = name_of_FMformat(format);

	 for (i = 0; i < cm->reg_format_count; i++) {
	     if ((cm->reg_formats[i]->registration_pending) && 
		 (strcmp(incoming_name, cm->reg_formats[i]->format_name) == 0)) {
		 CMcomplete_format_registration(cm->reg_formats[i], 0);
	     }
	 }
     }
     local_format = FFS_target_from_encode(conn->cm->FFScontext, data_buffer);
     original_format = FFSTypeHandle_from_encode(conn->cm->FFScontext, data_buffer);
     if (local_format == NULL) {
	 if (conn->cm->unregistered_format_handler) {
	     conn->cm->unregistered_format_handler(conn, name_of_FMformat(FMFormat_of_original(original_format)));
	 } else {
	     fprintf(stderr, "No conversion found for incoming CM message\n");
	 }
	 return 0;
     }
     CMtrace_out(cm, CMDataVerbose, "CM - Receiving record of type %s, FFSformat %p\n", 
		 name_of_FMformat(FMFormat_of_original(original_format)), original_format);
     for (i=0; i< cm->in_format_count; i++) {
	 if (cm->in_formats[i].format == local_format) {
	     cm_format = &cm->in_formats[i];
	     CMtrace_out(cm, CMDataVerbose, "CM - Found incoming cm_format %p, matching FFSformat %p\n", 
			 cm_format, local_format);
	 }
     }
     if (cm_format == NULL) {
	 cm_format = CMidentify_rollbackCMformat(cm, data_buffer);
	 CMtrace_out(cm, CMDataVerbose, "CM - Created cm_format %p, matching FFSformat %p\n", 
		     cm_format, original_format);
	 if(cm_format) {
	     CMtrace_out(cm, CMDataVerbose, "CM - Calling CMcreate_conversion type %s, format %p\n", 
			 name_of_FMformat(FMFormat_of_original(original_format)), original_format);
	     CMcreate_conversion(cm, cm_format);
	     CMtrace_out(cm, CMDataVerbose, "CM - after CMcreate_conversion format %p, has_conversion is %d\n", 
			 original_format, FFShas_conversion(original_format));
	 }
     }

     if ((cm_format == NULL) || (cm_format->handler == NULL)) {
	 fprintf(stderr, "CM - No handler for incoming data of this version of format \"%s\"\n",
		 name_of_FMformat(FMFormat_of_original(original_format)));
	 return 0;
     } else if (!FFShas_conversion(original_format)) {
	 CMcreate_conversion(cm, cm_format);
     }
     assert(FFShas_conversion(original_format));

     if (FFSdecode_in_place_possible(original_format)) {
	 if (!FFSdecode_in_place(cm->FFScontext, data_buffer, 
					(void**) (intptr_t) &decode_buffer)) {
	     printf("Decode failed\n");
	     return 0;
	 }
     } else {
	 decoded_length = FFS_est_decode_length(cm->FFScontext, data_buffer, data_length);
	 cm_decode_buf = cm_get_data_buf(cm, decoded_length);
	 decode_buffer = cm_decode_buf->buffer;
	 FFSdecode_to_buffer(cm->FFScontext, data_buffer, decode_buffer);
     }
     if(cm_format->older_format) {
 #ifdef EVOL
	 if(!process_old_format_data(cm, cm_format, &decode_buffer, &cm_decode_buf)){
	     return 0;
	 }
 #endif
     }
     if (CMtrace_on(conn->cm, CMDataVerbose)) {
	 static int dump_char_limit = 256;
	 static int warned = 0;
	 static int size_set = 0;
	 int r;
	 if (size_set == 0) {
	     char *size_str = getenv("CMDumpSize");
	     size_set++;
	     if (size_str != NULL) {
		 dump_char_limit = atoi(size_str);
	     }
	 }
	 fprintf(cm->CMTrace_file, "CM - record type %s, contents are:\n  ", name_of_FMformat(FMFormat_of_original(cm_format->format)));
	 r = FMfdump_data(cm->CMTrace_file, FMFormat_of_original(cm_format->format), decode_buffer, dump_char_limit);
	 if (!r && !warned) {
	     printf("\n\n  ****  Warning **** CM record dump truncated\n");
	     printf("  To change size limits, set CMDumpSize environment variable.\n");
	     warned++;
	 }
	 fprintf(cm->CMTrace_file, "\n=======\n");
     }
     if (attrs == NULL) {
	 attrs = CMcreate_attr_list(cm);
	 CMattr_merge_lists(cm, attrs, conn->attrs);
     } else {
	 CMattr_merge_lists(cm, attrs, conn->attrs);
     }

     /* 
      *  Handler may recurse, so clear these structures first
      */
     CMtrace_out(cm, CMFreeVerbose, "CM - add reference connection %p - handler\n", conn);
     INT_CMConnection_add_reference(conn);
     {
         CMHandlerFunc handler = cm_format->handler;
	 void *client_data = cm_format->client_data;
	 CMbuffer local = NULL;
	 if ((cm_buffer == NULL) && (decode_buffer == NULL)) {
	     local = fill_cmbuffer(cm, buffer, length);
	     buffer = local->buffer;
	 }
	 CManager_unlock(cm);
	 handler(cm, conn, decode_buffer, client_data, attrs);
	 CManager_lock(cm);
	 if (local) cm_return_data_buf(cm, local);
	 CMtrace_out(cm, CMFreeVerbose, "CM - delete reference connection %p - handler\n", conn);
	 INT_CMConnection_dereference(conn);
     }
     if (cm_decode_buf) {
	 cm_return_data_buf(cm, cm_decode_buf);
	 cm_decode_buf = NULL;
     }
     if (attrs) {
	 INT_CMfree_attr_list(cm, attrs);
	 attrs = NULL;
     }
     CMtrace_out(cm, CMDataVerbose, "CM - Finish processing - record of type %s\n", 
		 name_of_FMformat(FMFormat_of_original(original_format)));
     return 0;
 }